

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::check_invariants(Solver *this)

{
  Clause *cls;
  uint uVar1;
  uint uVar2;
  VarData *pVVar3;
  uint *puVar4;
  ulong uVar5;
  bool bVar6;
  ostream *poVar7;
  Clause CVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int j;
  long lVar12;
  anon_struct_8_10_eb538618_for_header *paVar13;
  int i;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int i_1;
  int k;
  long lVar17;
  long lVar18;
  vec<unsigned_int> *pvVar19;
  vec<Minisat::Watcher> *pvVar20;
  Lit l_2;
  Lit l_1;
  Lit l;
  
  bVar6 = true;
  lVar18 = 0;
  for (uVar14 = 0; (long)uVar14 < (long)(this->trail).sz; uVar14 = uVar14 + 1) {
    pVVar3 = (this->vardata).data;
    iVar9 = *(int *)((long)&((this->trail).data)->x + lVar18) >> 1;
    iVar10 = pVVar3[iVar9].level;
    if ((((long)iVar10 != 0) && (pVVar3[iVar9].reason == 0xffffffff)) &&
       (uVar14 != (uint)(this->trail_lim).data[(long)iVar10 + -1])) {
      poVar7 = std::operator<<((ostream *)&std::cout,"c trail literal ");
      poVar7 = operator<<(poVar7,(Lit *)((long)&((this->trail).data)->x + lVar18));
      poVar7 = std::operator<<(poVar7," at level ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar10);
      poVar7 = std::operator<<(poVar7," (pos: ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)uVar14);
      poVar7 = std::operator<<(poVar7," has no proper reason clause");
      std::endl<char,std::char_traits<char>>(poVar7);
      bVar6 = false;
    }
    lVar18 = lVar18 + 4;
  }
  iVar10 = 0;
  do {
    pvVar19 = &this->clauses;
    if ((iVar10 != 0) && (pvVar19 = &this->learnts_core, iVar10 != 1)) {
      if (iVar10 == 4) {
        for (lVar18 = 0; lVar18 < (this->vardata).sz; lVar18 = lVar18 + 1) {
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            l_2.x = (uint)(iVar10 == 1) | (int)lVar18 * 2;
            pvVar20 = (this->watches).occs.data + (uint)l_2.x;
            lVar12 = 1;
            for (lVar11 = 0; uVar14 = (ulong)pvVar20->sz, lVar11 < (long)uVar14; lVar11 = lVar11 + 1
                ) {
              uVar1 = pvVar20->data[lVar11].cref;
              paVar13 = (anon_struct_8_10_eb538618_for_header *)
                        ((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar1);
              for (lVar17 = lVar12; (int)lVar17 < (int)uVar14; lVar17 = lVar17 + 1) {
                if (pvVar20->data[lVar17].cref == uVar1) {
                  poVar7 = std::operator<<((ostream *)&std::cout,"c found clause [");
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  poVar7 = std::operator<<(poVar7,"] ");
                  poVar7 = operator<<(poVar7,(Clause *)paVar13);
                  poVar7 = std::operator<<(poVar7," multiple times in watch lists of literal ");
                  poVar7 = operator<<(poVar7,&l_2);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  uVar14 = (ulong)(uint)pvVar20->sz;
                }
              }
              CVar8.header = *paVar13;
              if ((CVar8.header._0_4_ & 3) == 1) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c found deleted clause [");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"]");
                poVar7 = operator<<(poVar7,(Clause *)paVar13);
                poVar7 = std::operator<<(poVar7," in watch lists of literal ");
                poVar7 = operator<<(poVar7,&l_2);
                std::endl<char,std::char_traits<char>>(poVar7);
                CVar8.header = *paVar13;
              }
              if ((ulong)CVar8.header < 0xc00000000) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c found binary or smaller clause [")
                ;
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"]");
                poVar7 = operator<<(poVar7,(Clause *)paVar13);
                poVar7 = std::operator<<(poVar7," in watch list of literal ");
                poVar7 = operator<<(poVar7,&l_2);
                std::endl<char,std::char_traits<char>>(poVar7);
                bVar6 = false;
              }
              if ((*(uint *)(paVar13 + 1) != (l_2.x ^ 1U)) &&
                 (*(uint *)&paVar13[1].field_0x4 != (l_2.x ^ 1U))) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c wrong literals for clause [");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"] ");
                poVar7 = operator<<(poVar7,(Clause *)paVar13);
                poVar7 = std::operator<<(poVar7," are watched. Found in list for ");
                poVar7 = operator<<(poVar7,&l_2);
                std::endl<char,std::char_traits<char>>(poVar7);
                bVar6 = false;
              }
              lVar12 = lVar12 + 1;
            }
            pvVar20 = (this->watches_bin).occs.data + l_2.x;
            lVar12 = 1;
            for (lVar11 = 0; uVar14 = (ulong)pvVar20->sz, lVar11 < (long)uVar14; lVar11 = lVar11 + 1
                ) {
              uVar1 = pvVar20->data[lVar11].cref;
              paVar13 = (anon_struct_8_10_eb538618_for_header *)
                        ((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar1);
              for (lVar17 = lVar12; (int)lVar17 < (int)uVar14; lVar17 = lVar17 + 1) {
                if (pvVar20->data[lVar17].cref == uVar1) {
                  poVar7 = std::operator<<((ostream *)&std::cout,"c found clause [");
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  poVar7 = std::operator<<(poVar7,"] ");
                  poVar7 = operator<<(poVar7,(Clause *)paVar13);
                  poVar7 = std::operator<<(poVar7," multiple times in watch lists of literal ");
                  poVar7 = operator<<(poVar7,&l_2);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  uVar14 = (ulong)(uint)pvVar20->sz;
                }
              }
              CVar8.header = *paVar13;
              if ((CVar8.header._0_4_ & 3) == 1) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c found deleted clause [");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"]");
                poVar7 = operator<<(poVar7,(Clause *)paVar13);
                poVar7 = std::operator<<(poVar7," in watch lists of literal ");
                poVar7 = operator<<(poVar7,&l_2);
                std::endl<char,std::char_traits<char>>(poVar7);
                CVar8.header = *paVar13;
              }
              if (((ulong)CVar8.header & 0xfffffffc00000000) != 0x800000000) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c found non-binary clause [");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"]");
                poVar7 = operator<<(poVar7,(Clause *)paVar13);
                poVar7 = std::operator<<(poVar7," in binary watch list of literal ");
                poVar7 = operator<<(poVar7,&l_2);
                std::endl<char,std::char_traits<char>>(poVar7);
                bVar6 = false;
              }
              if ((*(uint *)(paVar13 + 1) != (l_2.x ^ 1U)) &&
                 (*(uint *)&paVar13[1].field_0x4 != (l_2.x ^ 1U))) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c wrong literals for clause [");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"] ");
                poVar7 = operator<<(poVar7,(Clause *)paVar13);
                poVar7 = std::operator<<(poVar7," are watched. Found in list for ");
                poVar7 = operator<<(poVar7,&l_2);
                std::endl<char,std::char_traits<char>>(poVar7);
                bVar6 = false;
              }
              lVar12 = lVar12 + 1;
            }
          }
          if ((this->seen).data[lVar18] != '\0') {
            poVar7 = std::operator<<((ostream *)&std::cout,"c seen for variable ");
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)lVar18);
            poVar7 = std::operator<<(poVar7," is not 0, but ");
            poVar7 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar7,(int)(this->seen).data[lVar18]);
            std::endl<char,std::char_traits<char>>(poVar7);
            bVar6 = false;
          }
        }
        iVar10 = (this->old_trail).sz;
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        iVar9 = 0;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        while (iVar10 = iVar9 + -1, iVar9 != 0) {
          uVar1 = (this->old_trail).data[this->old_trail_qhead].x;
          uVar14 = (ulong)(this->oldreasons).data[(int)uVar1 >> 1];
          iVar9 = iVar10;
          if ((uVar14 != 0xffffffff) &&
             ((*(ulong *)(puVar4 + uVar14) & 0xfffffffc00000000) != 0x800000000)) {
            bVar6 = (bool)(bVar6 & puVar4[uVar14 + 2] == uVar1);
          }
        }
        return bVar6;
      }
      pvVar19 = &this->learnts_tier2 + (iVar10 != 2);
    }
    for (lVar18 = 0; lVar18 < pvVar19->sz; lVar18 = lVar18 + 1) {
      uVar1 = pvVar19->data[lVar18];
      puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar14 = *(ulong *)(puVar4 + uVar1);
      if (((uint)uVar14 & 3) != 1) {
        cls = (Clause *)(puVar4 + uVar1);
        if ((uVar14 & 0xfffffffc00000000) == 0x400000000) {
          poVar7 = std::operator<<((ostream *)&std::cout,"c there should not be unit clauses! [");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"]");
          poVar7 = operator<<(poVar7,cls);
          std::endl<char,std::char_traits<char>>(poVar7);
          bVar6 = false;
        }
        else {
          lVar12 = 0;
          if (uVar14 < 0xc00000000) {
            for (; lVar12 != 2; lVar12 = lVar12 + 1) {
              uVar14 = (long)*(int *)(&cls[1].header.field_0x0 + lVar12 * 4) ^ 1;
              l_1.x = (int)uVar14;
              pvVar20 = (this->watches_bin).occs.data;
              uVar2 = pvVar20[uVar14].sz;
              uVar15 = 0;
              if (0 < (int)uVar2) {
                uVar15 = (ulong)uVar2;
              }
              uVar5 = 0;
              do {
                uVar16 = uVar5;
                if (uVar15 == uVar16) {
                  iVar9 = 0;
                  goto LAB_00119830;
                }
                uVar5 = uVar16 + 1;
              } while (pvVar20[uVar14].data[uVar16].cref != uVar1);
              iVar9 = 1;
LAB_00119830:
              if ((long)(int)uVar2 <= (long)uVar16) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c could not find clause[");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"] ");
                poVar7 = operator<<(poVar7,cls);
                poVar7 = std::operator<<(poVar7," in watcher for lit [");
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)lVar12);
                poVar7 = std::operator<<(poVar7,"]");
                poVar7 = operator<<(poVar7,&l_1);
                poVar7 = std::operator<<(poVar7," 1 time, but ");
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar9);
                poVar7 = std::operator<<(poVar7," times");
                std::endl<char,std::char_traits<char>>(poVar7);
                bVar6 = false;
              }
            }
          }
          else {
            for (; lVar12 != 2; lVar12 = lVar12 + 1) {
              uVar14 = (long)*(int *)(&cls[1].header.field_0x0 + lVar12 * 4) ^ 1;
              l.x = (int)uVar14;
              pvVar20 = (this->watches).occs.data;
              uVar2 = pvVar20[uVar14].sz;
              uVar15 = 0;
              if (0 < (int)uVar2) {
                uVar15 = (ulong)uVar2;
              }
              uVar5 = 0;
              do {
                uVar16 = uVar5;
                if (uVar15 == uVar16) {
                  iVar9 = 0;
                  goto LAB_00119723;
                }
                uVar5 = uVar16 + 1;
              } while (pvVar20[uVar14].data[uVar16].cref != uVar1);
              iVar9 = 1;
LAB_00119723:
              if ((long)(int)uVar2 <= (long)uVar16) {
                poVar7 = std::operator<<((ostream *)&std::cout,"c could not find clause[");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,"] ");
                poVar7 = operator<<(poVar7,cls);
                poVar7 = std::operator<<(poVar7," in watcher for lit [");
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)lVar12);
                poVar7 = std::operator<<(poVar7,"]");
                poVar7 = operator<<(poVar7,&l);
                poVar7 = std::operator<<(poVar7," 1 time, but ");
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar9);
                poVar7 = std::operator<<(poVar7," times");
                std::endl<char,std::char_traits<char>>(poVar7);
                bVar6 = false;
              }
            }
          }
        }
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

bool Solver::check_invariants()
{
    TRACE(printf("c check solver invariants\n");)

    bool pass = true;
    bool fatal_on_watch_removed = false;

    /* ensure that each assigned literal has a proper reason clause as well */
    for (int i = 0; i < trail.size(); ++i) {
        Var v = var(trail[i]);
        int l = level(v);
        if (!(l == 0 || reason(v) != CRef_Undef || trail_lim[l - 1] == i)) {
            std::cout << "c trail literal " << trail[i] << " at level " << l << " (pos: " << i
                      << " has no proper reason clause" << std::endl;
            pass = false;
        }
    }

    // check whether clause is in solver in the right watch lists
    for (int p = 0; p < 4; ++p) {

        const vec<CRef> &clause_list = (p == 0 ? clauses : (p == 1 ? learnts_core : (p == 2 ? learnts_tier2 : learnts_local)));
        for (int i = 0; i < clause_list.size(); ++i) {
            const CRef cr = clause_list[i];
            const Clause &c = ca[cr];
            if (c.mark() == 1) {
                continue;
            }

            if (c.size() == 1) {
                std::cout << "c there should not be unit clauses! [" << cr << "]" << c << std::endl;
                pass = false;
            } else {
                if (c.size() > 2) {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                } else {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches_bin[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws.size(); ++k) {
                    CRef inner_cr = ws[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() <= 2) {
                    std::cout << "c found binary or smaller clause [" << wcr << "]" << c << " in watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
            vec<Watcher> &ws_bin = watches_bin[l];
            for (int j = 0; j < ws_bin.size(); ++j) {
                CRef wcr = ws_bin[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws_bin.size(); ++k) {
                    CRef inner_cr = ws_bin[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() != 2) {
                    std::cout << "c found non-binary clause [" << wcr << "]" << c << " in binary watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
        }
        if (seen[v] != 0) {
            std::cout << "c seen for variable " << v << " is not 0, but " << (int)seen[v] << std::endl;
            pass = false;
        }
    }

    for (int i = 0; i < old_trail.size(); ++i) {
        const Lit old_trail_top = old_trail[old_trail_qhead];
        const CRef old_reason = oldreasons[var(old_trail_top)];
        if (old_reason == CRef_Undef) continue;
        const Clause &c = ca[old_reason];
        assert((c.size() == 2 || c[0] == old_trail_top) && "assert literal has to be at first position");
        if (!(c.size() == 2 || c[0] == old_trail_top)) pass = false;
    }


    assert(pass && "some solver invariant check failed");
    return pass;
}